

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdEmuD3D56TexFormat::emulate_mthd(MthdEmuD3D56TexFormat *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  byte local_81;
  byte local_71;
  byte local_65;
  uint local_64;
  int local_38;
  int i;
  int wrapv;
  int wrapu;
  int sv;
  int su;
  int mips;
  int fmt;
  int sfmt;
  int omips;
  uint32_t rval;
  MthdEmuD3D56TexFormat *this_local;
  
  pgraph_celsius_pre_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  uVar6 = (this->super_SingleMthdTest).super_MthdTest.val;
  sfmt = uVar6 & 0xfffff002;
  sv = (int)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x30) >> 0x3c);
  su = (int)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x34) >> 0x3c);
  uVar3 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2c) >> 0x3c);
  local_64 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x28) >> 0x3c);
  uVar4 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x25) >> 0x3d);
  uVar2 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x21) >> 0x3d);
  if (uVar4 == 2) {
    sfmt = uVar6 & 0xf0fff002 | 0x2000000;
  }
  if (uVar4 != 1) {
    sfmt = sfmt & 0xf7ffffff;
  }
  if (uVar4 == 0) {
    bVar1 = nv04_pgraph_is_nv15p
                      (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest
                        .super_Test.chipset);
    iVar5 = 3;
    if (bVar1) {
      iVar5 = 2;
    }
    sfmt = sfmt & 0xf8ffffffU | iVar5 << 0x18;
  }
  if (uVar4 == 4) {
    sfmt = sfmt & 0xf8ffffffU | 0x3000000;
  }
  if (uVar4 == 5) {
    bVar1 = nv04_pgraph_is_nv15p
                      (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest
                        .super_Test.chipset);
    sfmt = sfmt & 0xf8ffffffU | (uint)bVar1 << 0x18;
  }
  if (5 < uVar4) {
    sfmt = sfmt & 0xf8ffffff;
  }
  if (uVar2 != 1) {
    sfmt = sfmt & 0x7fffffff;
  }
  if (uVar2 == 0) {
    bVar1 = nv04_pgraph_is_nv15p
                      (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest
                        .super_Test.chipset);
    iVar5 = 2;
    if (bVar1) {
      iVar5 = 0;
    }
    sfmt = sfmt & 0x8fffffffU | iVar5 << 0x1c;
  }
  if (uVar2 == 7) {
    sfmt = sfmt & 0x8fffffff;
  }
  if (uVar2 == 4) {
    sfmt = sfmt & 0x8fffffffU | 0x30000000;
  }
  if (uVar2 == 5) {
    sfmt = sfmt & 0x8fffffffU | 0x10000000;
  }
  if (uVar2 == 6) {
    bVar1 = nv04_pgraph_is_nv15p
                      (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest
                        .super_Test.chipset);
    iVar5 = 0;
    if (bVar1) {
      iVar5 = 2;
    }
    sfmt = sfmt & 0x8fffffffU | iVar5 << 0x1c;
  }
  if ((uVar3 < (uint)sv) && (local_64 < (uint)sv)) {
    if (local_64 < uVar3) {
      local_64 = uVar3;
    }
    sv = local_64 + 1;
  }
  if ((((this->super_SingleMthdTest).super_MthdTest.cls == 0x54) ||
      ((this->super_SingleMthdTest).super_MthdTest.cls == 0x94)) && (su == 1)) {
    su = 0;
  }
  uVar6 = sfmt & 0xffff0fffU |
          (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3a) >> 0x3f) << 4) |
          (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x38) >> 0x3f) << 6) |
          su << 7 | (sv & 0xfU) << 0xc;
  if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource <<
                 0x3e)) {
    for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
      if ((this->which & 1 << ((byte)local_38 & 0x1f)) != 0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[local_38]
             = uVar6 | (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                       bundle_tex_format[local_38] & 8;
      }
    }
    if (((this->super_SingleMthdTest).super_MthdTest.cls == 0x94) ||
       ((this->super_SingleMthdTest).super_MthdTest.cls == 0x54)) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_control_a[0] =
           (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3c) >> 0x3e) |
           0x4003ffc0;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_control_a[1] =
           (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3c) >> 0x3e) |
           0x3ffc0;
      local_65 = 0;
      if (((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                         bundle_config_b << 0x39) < 0) &&
         (local_65 = 0, -1 < (long)((ulong)uVar6 << 0x24))) {
        local_65 = (long)((ulong)uVar6 << 0x20) < 0 ^ 0xff;
      }
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b &
           0xfffffffb | (uint)(local_65 & 1) << 2;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b &
           0xfffeffff;
      pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,4,
                          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                          bundle_tex_format[0],false);
      pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,6,
                          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                          bundle_tex_control_a[0],false);
      pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,7,
                          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                          bundle_tex_control_a[1],true);
    }
    else {
      if (this->which == 2) {
        local_71 = 0;
        if (((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                           bundle_config_b << 0x39) < 0) &&
           (local_71 = 0, -1 < (long)((ulong)uVar6 << 0x24))) {
          local_71 = (long)((ulong)uVar6 << 0x20) < 0 ^ 0xff;
        }
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b &
             0xfffeffff | (uint)(local_71 & 1) << 0x10;
      }
      pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                          this->which + 3,
                          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                          bundle_tex_format[this->which + -1],true);
    }
    if ((this->which & 1U) != 0) {
      local_81 = 0;
      if (((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                         bundle_config_b << 0x39) < 0) &&
         (local_81 = 0, -1 < (long)((ulong)uVar6 << 0x24))) {
        local_81 = (long)((ulong)uVar6 << 0x20) < 0 ^ 0xff;
      }
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b &
           0xfffffffb | (uint)(local_81 & 1) << 2;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a &
         0xefffffff | 0x10000000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[2] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[3] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b;
  }
  if ((this->which & 1U) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xffff7fff |
         0x8000;
  }
  if ((this->which & 2U) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xffdfffff |
         0x200000;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t rval = val & 0xfffff002;
		int omips = extr(val, 12, 4);
		int sfmt = extr(val, 8, 4);
		int fmt = sfmt;
		int mips = omips;
		int su = extr(val, 16, 4);
		int sv = extr(val, 20, 4);
		int wrapu = extr(val, 24, 3);
		int wrapv = extr(val, 28, 3);
		if (wrapu == 2)
			insrt(rval, 24, 4, 2);
		if (wrapu != 1)
			insrt(rval, 27, 1, 0);
		if (wrapu == 0)
			insrt(rval, 24, 3, nv04_pgraph_is_nv15p(&chipset) ? 2 : 3);
		if (wrapu == 4)
			insrt(rval, 24, 3, 3);
		if (wrapu == 5)
			insrt(rval, 24, 3, nv04_pgraph_is_nv15p(&chipset) ? 1 : 0);
		if (wrapu > 5)
			insrt(rval, 24, 3, 0);
		if (wrapv != 1)
			insrt(rval, 31, 1, 0);
		if (wrapv == 0)
			insrt(rval, 28, 3, nv04_pgraph_is_nv15p(&chipset) ? 0 : 2);
		if (wrapv == 7)
			insrt(rval, 28, 3, 0);
		if (wrapv == 4)
			insrt(rval, 28, 3, 3);
		if (wrapv == 5)
			insrt(rval, 28, 3, 1);
		if (wrapv == 6)
			insrt(rval, 28, 3, nv04_pgraph_is_nv15p(&chipset) ? 2 : 0);
		if (mips > su && mips > sv)
			mips = (su > sv ? su : sv) + 1;
		if (cls == 0x54 || cls == 0x94) {
			if (sfmt == 1)
				fmt = 0;
		}
		insrt(rval, 4, 1, extr(val, 5, 1));
		insrt(rval, 6, 1, extr(val, 7, 1));
		insrt(rval, 7, 5, fmt);
		insrt(rval, 12, 4, mips);
		if (!extr(exp.nsource, 1, 1)) {
			for (int i = 0; i < 2; i++) {
				if (which & 1 << i) {
					exp.bundle_tex_format[i] = rval | (exp.bundle_tex_format[i] & 8);
				}
			}
			if (cls == 0x94 || cls == 0x54) {
				exp.bundle_tex_control_a[0] = 0x4003ffc0 | extr(val, 2, 2);
				exp.bundle_tex_control_a[1] = 0x3ffc0 | extr(val, 2, 2);
				insrt(exp.celsius_xf_misc_b, 2, 1,
					extr(exp.bundle_config_b, 6, 1) &&
					!extr(rval, 27, 1) && !extr(rval, 31, 1));
				insrt(exp.celsius_xf_misc_b, 16, 1, 0);
				pgraph_celsius_icmd(&exp, 4, exp.bundle_tex_format[0], false);
				pgraph_celsius_icmd(&exp, 6, exp.bundle_tex_control_a[0], false);
				pgraph_celsius_icmd(&exp, 7, exp.bundle_tex_control_a[1], true);
			} else {
				if (which == 2) {
					insrt(exp.celsius_xf_misc_b, 16, 1,
						extr(exp.bundle_config_b, 6, 1) &&
						!extr(rval, 27, 1) && !extr(rval, 31, 1));
				}
				pgraph_celsius_icmd(&exp, 4 + which - 1, exp.bundle_tex_format[which - 1], true);
			}
			if (which & 1) {
				insrt(exp.celsius_xf_misc_b, 2, 1,
					extr(exp.bundle_config_b, 6, 1) &&
					!extr(rval, 27, 1) && !extr(rval, 31, 1));
			}
			insrt(exp.celsius_xf_misc_a, 28, 1, 1);
			exp.celsius_pipe_junk[2] = exp.celsius_xf_misc_a;
			exp.celsius_pipe_junk[3] = exp.celsius_xf_misc_b;
		}
		if (which & 1)
			insrt(exp.valid[1], 15, 1, 1);
		if (which & 2)
			insrt(exp.valid[1], 21, 1, 1);
	}